

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void google::protobuf::descriptor_unittest::ExtractDebugString
               (FileDescriptor *file,
               flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *visited,vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *debug_strings)

{
  pointer pcVar1;
  anon_union_8_1_a8a14541_for_iterator_2 aVar2;
  FileDescriptor *file_00;
  int i;
  int index;
  string local_80;
  anon_union_8_1_a8a14541_for_iterator_2 local_60;
  pointer local_58;
  char *local_50;
  pointer local_48;
  char local_40 [8];
  undefined8 uStack_38;
  
  local_80._M_string_length = (size_type)(file->name_->_M_dataplus)._M_p;
  local_80._M_dataplus._M_p = (pointer)file->name_->_M_string_length;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::emplace<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
              *)&local_60,
             &visited->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ,(basic_string_view<char,_std::char_traits<char>_> *)&local_80);
  if (local_50._0_1_ == (string)0x1) {
    for (index = 0; index < file->dependency_count_; index = index + 1) {
      file_00 = FileDescriptor::dependency(file,index);
      ExtractDebugString(file_00,visited,debug_strings);
    }
    pcVar1 = (file->name_->_M_dataplus)._M_p;
    aVar2 = (anon_union_8_1_a8a14541_for_iterator_2)file->name_->_M_string_length;
    FileDescriptor::DebugString_abi_cxx11_(&local_80,file);
    local_50 = local_40;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      uStack_38 = local_80.field_2._8_8_;
    }
    else {
      local_50 = local_80._M_dataplus._M_p;
    }
    local_48 = (pointer)local_80._M_string_length;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_60 = aVar2;
    local_58 = pcVar1;
    std::
    vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>>
    ::
    emplace_back<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
              ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>>
                *)debug_strings,
               (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_60);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return;
}

Assistant:

void ExtractDebugString(
    const FileDescriptor* file, absl::flat_hash_set<absl::string_view>* visited,
    std::vector<std::pair<absl::string_view, std::string>>* debug_strings) {
  if (!visited->insert(file->name()).second) {
    return;
  }
  for (int i = 0; i < file->dependency_count(); ++i) {
    ExtractDebugString(file->dependency(i), visited, debug_strings);
  }
  debug_strings->push_back({file->name(), file->DebugString()});
}